

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkLANG.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution::checkLANG
               (int lang)

{
  undefined8 *puVar1;
  char *unaff_RBX;
  
  if (0xfffffffa < lang - 0x10U) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  tools::Log::info<char_const*>(unaff_RBX);
  tools::Log::info<char_const*,int>("LANG value: {}",lang);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
checkLANG( int lang ) {

  if ( ( lang != 11 ) and ( lang != 12 ) and ( lang != 13 ) and
       ( lang != 14 ) and ( lang != 15 ) ) {

    Log::error( "Encountered illegal LANG value for a tabulated LAW=1" );
    Log::info( "LANG must be equal to 11, 12, 13, 14 or 15" );
    Log::info( "LANG value: {}", lang );
    throw std::exception();
  }
}